

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::MillisecondsOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  long *plVar2;
  int64_t *piVar3;
  unsigned_long *puVar4;
  timestamp_t input_00;
  timestamp_t *ptVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong *puVar6;
  SelectionVector *pSVar7;
  data_ptr_t pdVar8;
  bool bVar9;
  dtime_t dVar10;
  VectorBuffer *pVVar11;
  idx_t iVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  long lVar14;
  optional_idx dict_size;
  UnifiedVectorFormat local_88;
  idx_t local_38;
  
  VVar1 = input->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    plVar2 = (long *)result->data;
    ptVar5 = (timestamp_t *)input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::MillisecondsOperator>>
              (ptVar5,plVar2,count,&input->validity,&result->validity,dataptr,adds_nulls);
    return;
  }
  if (VVar1 != DICTIONARY_VECTOR) {
    if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      plVar2 = (long *)result->data;
      piVar3 = (int64_t *)input->data;
      puVar4 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      input_00.value = *piVar3;
      bVar9 = Value::IsFinite<duckdb::timestamp_t>(input_00);
      if (bVar9) {
        dVar10 = Timestamp::GetTime(input_00);
        lVar14 = (dVar10.micros % 60000000) / 1000;
      }
      else {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_88,&local_38);
          pdVar8 = local_88.data;
          pSVar7 = local_88.sel;
          local_88.sel = (SelectionVector *)0x0;
          local_88.data = (data_ptr_t)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar7;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar8;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        puVar6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        *puVar6 = *puVar6 & 0xfffffffffffffffe;
        lVar14 = 0;
      }
      *plVar2 = lVar14;
      return;
    }
    goto LAB_00f8759b;
  }
  if (errors != CANNOT_ERROR) goto LAB_00f8759b;
  DictionaryVector::VerifyDictionary(input);
  pVVar11 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
  local_88.sel = (SelectionVector *)pVVar11[1].data.allocator.ptr;
  if (((Allocator *)local_88.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar12 = optional_idx::GetIndex((optional_idx *)&local_88), count < iVar12 * 2)) {
LAB_00f8781b:
    bVar9 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(input);
    pVVar11 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->auxiliary);
    bVar9 = *(char *)&pVVar11[1]._vptr_VectorBuffer == '\0';
    if (!bVar9) goto LAB_00f8781b;
    plVar2 = (long *)result->data;
    ptVar5 = (timestamp_t *)pVVar11[1].data.pointer;
    iVar12 = optional_idx::GetIndex((optional_idx *)&local_88);
    FlatVector::VerifyFlatVector((Vector *)(pVVar11 + 1));
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::MillisecondsOperator>>
              (ptVar5,plVar2,iVar12,(ValidityMask *)&pVVar11[1].data.allocated_size,
               &result->validity,dataptr,adds_nulls);
    DictionaryVector::VerifyDictionary(input);
    pVVar11 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&input->buffer);
    iVar12 = optional_idx::GetIndex((optional_idx *)&local_88);
    Vector::Dictionary(result,result,iVar12,(SelectionVector *)(pVVar11 + 1),count);
  }
  if (bVar9) {
    return;
  }
LAB_00f8759b:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_88);
  Vector::ToUnifiedFormat(input,count,&local_88);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar7 = local_88.sel;
  plVar2 = (long *)result->data;
  FlatVector::VerifyFlatVector(result);
  ExecuteLoop<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::MillisecondsOperator>>
            ((timestamp_t *)local_88.data,plVar2,count,pSVar7,&local_88.validity,&result->validity,
             dataptr,adds_nulls);
  if (local_88.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}